

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O2

int archive_filter_uuencode_write(archive_write_filter *f,void *buff,size_t length)

{
  uchar uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong length_00;
  int iVar4;
  
  iVar4 = 0;
  if (length != 0) {
    pvVar2 = f->data;
    uVar3 = *(ulong *)((long)pvVar2 + 0x40);
    if (uVar3 != 0) {
      while( true ) {
        if ((0x2c < uVar3) || (length == 0)) break;
        uVar1 = *buff;
        buff = (void *)((long)buff + 1);
        *(ulong *)((long)pvVar2 + 0x40) = uVar3 + 1;
        *(uchar *)((long)pvVar2 + uVar3 + 0x48) = uVar1;
        uVar3 = *(ulong *)((long)pvVar2 + 0x40);
        length = length - 1;
      }
      if (uVar3 < 0x2d) {
        return 0;
      }
      uu_encode((archive_string *)((long)pvVar2 + 0x20),(uchar *)((long)pvVar2 + 0x48),0x2d);
      *(undefined8 *)((long)pvVar2 + 0x40) = 0;
    }
    for (; 0x2c < length; length = length - 0x2d) {
      uu_encode((archive_string *)((long)pvVar2 + 0x20),(uchar *)buff,0x2d);
      buff = (void *)((long)buff + 0x2d);
    }
    if (length != 0) {
      memcpy((void *)((long)pvVar2 + 0x48),buff,length);
      *(size_t *)((long)pvVar2 + 0x40) = length;
    }
    uVar3 = *(ulong *)((long)pvVar2 + 0x28);
    length_00 = *(ulong *)((long)pvVar2 + 0x38);
    iVar4 = 0;
    while (length_00 <= uVar3) {
      iVar4 = __archive_write_filter(f->next_filter,*(void **)((long)pvVar2 + 0x20),length_00);
      memmove(*(void **)((long)pvVar2 + 0x20),
              (void *)((long)*(void **)((long)pvVar2 + 0x20) + *(long *)((long)pvVar2 + 0x38)),
              *(long *)((long)pvVar2 + 0x28) - *(long *)((long)pvVar2 + 0x38));
      length_00 = *(ulong *)((long)pvVar2 + 0x38);
      uVar3 = *(long *)((long)pvVar2 + 0x28) - length_00;
      *(ulong *)((long)pvVar2 + 0x28) = uVar3;
    }
  }
  return iVar4;
}

Assistant:

static int
archive_filter_uuencode_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;
	const unsigned char *p = buff;
	int ret = ARCHIVE_OK;

	if (length == 0)
		return (ret);

	if (state->hold_len) {
		while (state->hold_len < LBYTES && length > 0) {
			state->hold[state->hold_len++] = *p++;
			length--;
		}
		if (state->hold_len < LBYTES)
			return (ret);
		uu_encode(&state->encoded_buff, state->hold, LBYTES);
		state->hold_len = 0;
	}

	for (; length >= LBYTES; length -= LBYTES, p += LBYTES)
		uu_encode(&state->encoded_buff, p, LBYTES);

	/* Save remaining bytes. */
	if (length > 0) {
		memcpy(state->hold, p, length);
		state->hold_len = length;
	}
	while (archive_strlen(&state->encoded_buff) >= state->bs) {
		ret = __archive_write_filter(f->next_filter,
		    state->encoded_buff.s, state->bs);
		memmove(state->encoded_buff.s,
		    state->encoded_buff.s + state->bs,
		    state->encoded_buff.length - state->bs);
		state->encoded_buff.length -= state->bs;
	}

	return (ret);
}